

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O2

MeshGL * Csaszar(void)

{
  long lVar1;
  undefined4 *puVar2;
  MeshGL *in_RDI;
  undefined4 *puVar3;
  byte bVar4;
  undefined4 local_b8 [21];
  undefined1 local_64 [84];
  
  bVar4 = 0;
  memset(&in_RDI->vertProperties,0,0xdc);
  in_RDI->numProp = 3;
  puVar2 = &DAT_0018a178;
  puVar3 = local_b8;
  for (lVar1 = 0x15; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&in_RDI->vertProperties,local_b8,local_64);
  memcpy(local_b8,&DAT_0018a1cc,0xa8);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&in_RDI->triVerts,local_b8,
             &stack0xfffffffffffffff0);
  local_b8[0] = manifold::Manifold::ReserveIDs(1);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&in_RDI->runOriginalID,local_b8);
  return in_RDI;
}

Assistant:

MeshGL Csaszar() {
  MeshGL csaszar;
  csaszar.numProp = 3;
  csaszar.vertProperties = {-20, -20, -10,  //
                            -20, 20,  -15,  //
                            -5,  -8,  8,    //
                            0,   0,   30,   //
                            5,   8,   8,    //
                            20,  -20, -15,  //
                            20,  20,  -10};
  csaszar.triVerts = {1, 3, 6,  //
                      1, 6, 5,  //
                      2, 5, 6,  //
                      0, 2, 6,  //
                      0, 6, 4,  //
                      3, 4, 6,  //
                      1, 2, 3,  //
                      1, 4, 2,  //
                      1, 0, 4,  //
                      1, 5, 0,  //
                      3, 5, 4,  //
                      0, 5, 3,  //
                      0, 3, 2,  //
                      2, 4, 5};
  csaszar.runOriginalID = {Manifold::ReserveIDs(1)};
  return csaszar;
}